

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O0

void __thiscall QtMWidgets::DateTimePickerPrivate::updateTimeSpec(DateTimePickerPrivate *this)

{
  QDateTime local_28 [8];
  QDateTime local_20 [8];
  QDateTime local_18 [8];
  DateTimePickerPrivate *local_10;
  DateTimePickerPrivate *this_local;
  
  local_10 = this;
  QDateTime::toTimeSpec((TimeSpec)local_18);
  QDateTime::operator=(&this->minimum,local_18);
  QDateTime::~QDateTime(local_18);
  QDateTime::toTimeSpec((TimeSpec)local_20);
  QDateTime::operator=(&this->maximum,local_20);
  QDateTime::~QDateTime(local_20);
  QDateTime::toTimeSpec((TimeSpec)local_28);
  QDateTime::operator=(&this->value,local_28);
  QDateTime::~QDateTime(local_28);
  return;
}

Assistant:

void
DateTimePickerPrivate::updateTimeSpec()
{
	minimum = minimum.toTimeSpec( spec );
	maximum = maximum.toTimeSpec( spec );
	value = value.toTimeSpec( spec );
}